

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

Attribute * __thiscall tinyusdz::Attribute::operator=(Attribute *this,Attribute *param_1)

{
  ::std::__cxx11::string::_M_assign((string *)this);
  this->_varying_authored = param_1->_varying_authored;
  this->_variability = param_1->_variability;
  ::std::__cxx11::string::_M_assign((string *)&this->_type_name);
  primvar::PrimVar::operator=(&this->_var,&param_1->_var);
  std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
            ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&this->_paths,
             (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&param_1->_paths);
  AttrMetas::operator=(&this->_metas,&param_1->_metas);
  return this;
}

Assistant:

Attribute() = default;